

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircleShape.cpp
# Opt level: O0

Vector2f __thiscall sf::CircleShape::getPoint(CircleShape *this,size_t index)

{
  float fVar1;
  ulong in_RSI;
  long in_RDI;
  float fVar2;
  double dVar3;
  double dVar4;
  float y;
  float x;
  float angle;
  float local_3c;
  float local_28;
  Vector2f local_8;
  
  local_28 = (float)in_RSI;
  local_3c = (float)*(ulong *)(in_RDI + 0x158);
  fVar2 = ((local_28 + local_28) * 3.1415927) / local_3c + -1.5707964;
  dVar3 = std::cos((double)(ulong)(uint)fVar2);
  fVar1 = *(float *)(in_RDI + 0x150);
  dVar4 = std::sin((double)(ulong)(uint)fVar2);
  Vector2<float>::Vector2
            (&local_8,*(float *)(in_RDI + 0x150) + SUB84(dVar3,0) * fVar1,
             *(float *)(in_RDI + 0x150) + SUB84(dVar4,0) * *(float *)(in_RDI + 0x150));
  return local_8;
}

Assistant:

Vector2f CircleShape::getPoint(std::size_t index) const
{
    static const float pi = 3.141592654f;

    float angle = static_cast<float>(index) * 2.f * pi / static_cast<float>(m_pointCount) - pi / 2.f;
    float x = std::cos(angle) * m_radius;
    float y = std::sin(angle) * m_radius;

    return Vector2f(m_radius + x, m_radius + y);
}